

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_global_isFinite(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  double in_RAX;
  JSValue JVar3;
  int64_t iStack_10;
  double d;
  
  d = in_RAX;
  iVar1 = JS_ToFloat64(ctx,&d,*argv);
  if (iVar1 == 0) {
    uVar2 = (uint)((ulong)ABS(d) < 0x7ff0000000000000);
    iStack_10 = 1;
  }
  else {
    iStack_10 = 6;
    uVar2 = 0;
  }
  JVar3.u._4_4_ = 0;
  JVar3.u.int32 = uVar2;
  JVar3.tag = iStack_10;
  return JVar3;
}

Assistant:

static JSValue js_global_isFinite(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    BOOL res;
    double d;
    if (unlikely(JS_ToFloat64(ctx, &d, argv[0])))
        return JS_EXCEPTION;
    res = isfinite(d);
    return JS_NewBool(ctx, res);
}